

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucol_swp.cpp
# Opt level: O2

int32_t ucol_swap_63(UDataSwapper *ds,void *inData,int32_t length,void *outData,
                    UErrorCode *pErrorCode)

{
  int32_t *inData_00;
  char cVar1;
  int32_t i;
  int32_t iVar2;
  int32_t iVar3;
  int iVar4;
  UErrorCode UVar5;
  undefined4 extraout_var;
  long lVar6;
  int *piVar7;
  int iVar8;
  int iVar9;
  void *outData_00;
  ulong uVar10;
  char *fmt;
  uint length_00;
  int32_t local_98 [5];
  int local_84;
  int local_80;
  int local_7c;
  int local_78;
  int local_74;
  int local_70;
  int local_6c;
  int local_68;
  int local_64;
  int local_60;
  int local_5c;
  int local_58;
  int local_54;
  int local_50;
  int local_4c [3];
  undefined8 local_40;
  long local_38;
  
  if (U_ZERO_ERROR < *pErrorCode) {
    return 0;
  }
  iVar2 = udata_swapDataHeader_63(ds,inData,length,outData,pErrorCode);
  if (U_ZERO_ERROR < *pErrorCode) {
    *pErrorCode = U_ZERO_ERROR;
    iVar2 = anon_unknown.dwarf_2b5d88::swapFormatVersion3(ds,inData,length,outData,pErrorCode);
    return iVar2;
  }
  cVar1 = *(char *)((long)inData + 0xd);
  if ((((cVar1 != 'C' || *(byte *)((long)inData + 0xc) != 0x55) ||
       (cVar1 = 'C', *(char *)((long)inData + 0xe) != 'o')) ||
      (*(char *)((long)inData + 0xf) != 'l')) || (2 < (byte)(*(byte *)((long)inData + 0x10) - 3))) {
    udata_printError_63(ds,
                        "ucol_swap(): data format %02x.%02x.%02x.%02x (format version %02x.%02x) is not recognized as collation data\n"
                        ,(ulong)*(byte *)((long)inData + 0xc),cVar1,
                        (ulong)*(byte *)((long)inData + 0xe),(ulong)*(byte *)((long)inData + 0xf),
                        (ulong)*(byte *)((long)inData + 0x10),(ulong)*(byte *)((long)inData + 0x11))
    ;
    *pErrorCode = U_UNSUPPORTED_ERROR;
    return 0;
  }
  iVar4 = 0;
  if (-1 < length) {
    iVar4 = iVar2;
  }
  inData_00 = (int32_t *)((long)inData + (long)iVar2);
  length_00 = length - iVar4;
  outData_00 = (void *)((long)iVar2 + (long)outData);
  if (*(byte *)((long)inData + 0x10) < 4) {
    iVar4 = anon_unknown.dwarf_2b5d88::swapFormatVersion3
                      (ds,inData_00,length_00,outData_00,pErrorCode);
    goto LAB_002b9a18;
  }
  if (length_00 < 8) {
LAB_002b99fd:
    udata_printError_63(ds,
                        "ucol_swap(formatVersion=4): too few bytes (%d after header) for collation data\n"
                        ,(ulong)length_00);
    UVar5 = U_INDEX_OUTOFBOUNDS_ERROR;
  }
  else {
    local_98[0] = udata_readInt32_63(ds,*inData_00);
    iVar8 = local_98[0] * 4;
    if ((-1 < (int)length_00) && ((int)length_00 < iVar8)) goto LAB_002b99fd;
    local_40 = CONCAT44(extraout_var,local_98[0]);
    local_38 = (long)local_98[0];
    for (uVar10 = 1; (lVar6 = local_38, uVar10 < 0x14 && ((long)uVar10 < local_38));
        uVar10 = uVar10 + 1) {
      iVar3 = udata_readInt32_63(ds,inData_00[uVar10]);
      local_98[uVar10] = iVar3;
    }
    for (; lVar6 < 0x14; lVar6 = lVar6 + 1) {
      local_98[lVar6] = -1;
    }
    iVar9 = (int)local_40;
    if (iVar9 < 0x14) {
      iVar4 = iVar8;
      if (5 < iVar9) {
        piVar7 = local_98 + (iVar9 - 1);
        goto LAB_002b99f1;
      }
    }
    else {
      piVar7 = local_4c;
LAB_002b99f1:
      iVar4 = *piVar7;
    }
    if ((int)length_00 < 0) goto LAB_002b9a18;
    if ((int)length_00 < iVar4) goto LAB_002b99fd;
    if (inData != outData) {
      memcpy(outData_00,inData_00,(long)iVar4);
    }
    (*ds->swapArray32)(ds,inData_00,iVar8,outData_00,pErrorCode);
    if (local_80 - local_84 != 0 && local_84 <= local_80) {
      (*ds->swapArray32)(ds,(void *)((long)inData_00 + (long)local_84),local_80 - local_84,
                         (void *)((long)local_84 + (long)outData_00),pErrorCode);
    }
    if (local_78 - local_7c != 0 && local_7c <= local_78) {
      utrie2_swap_63(ds,(void *)((long)inData_00 + (long)local_7c),local_78 - local_7c,
                     (void *)((long)local_7c + (long)outData_00),pErrorCode);
    }
    if (local_78 < local_74) {
      fmt = "ucol_swap(formatVersion=4): unknown data at IX_RESERVED8_OFFSET\n";
LAB_002b9aee:
      udata_printError_63(ds,fmt);
      UVar5 = U_UNSUPPORTED_ERROR;
    }
    else {
      if (local_70 - local_74 != 0 && local_74 <= local_70) {
        (*ds->swapArray64)(ds,(void *)((long)inData_00 + (long)local_74),local_70 - local_74,
                           (void *)((long)local_74 + (long)outData_00),pErrorCode);
      }
      if (local_70 < local_6c) {
        fmt = "ucol_swap(formatVersion=4): unknown data at IX_RESERVED10_OFFSET\n";
        goto LAB_002b9aee;
      }
      if (local_68 - local_6c != 0 && local_6c <= local_68) {
        (*ds->swapArray32)(ds,(void *)((long)inData_00 + (long)local_6c),local_68 - local_6c,
                           (void *)((long)local_6c + (long)outData_00),pErrorCode);
      }
      if (local_64 - local_68 != 0 && local_68 <= local_64) {
        (*ds->swapArray32)(ds,(void *)((long)inData_00 + (long)local_68),local_64 - local_68,
                           (void *)((long)local_68 + (long)outData_00),pErrorCode);
      }
      if (local_60 - local_64 != 0 && local_64 <= local_60) {
        (*ds->swapArray16)(ds,(void *)((long)inData_00 + (long)local_64),local_60 - local_64,
                           (void *)((long)local_64 + (long)outData_00),pErrorCode);
      }
      if (local_5c - local_60 != 0 && local_60 <= local_5c) {
        (*ds->swapArray16)(ds,(void *)((long)inData_00 + (long)local_60),local_5c - local_60,
                           (void *)((long)local_60 + (long)outData_00),pErrorCode);
      }
      if (local_58 - local_5c != 0 && local_5c <= local_58) {
        (*ds->swapArray16)(ds,(void *)((long)inData_00 + (long)local_5c),local_58 - local_5c,
                           (void *)((long)local_5c + (long)outData_00),pErrorCode);
      }
      if (local_54 - local_58 != 0 && local_58 <= local_54) {
        (*ds->swapArray16)(ds,(void *)((long)inData_00 + (long)local_58),local_54 - local_58,
                           (void *)((long)outData_00 + (long)local_58),pErrorCode);
      }
      if (local_4c[0] <= local_50) goto LAB_002b9a18;
      udata_printError_63(ds,"ucol_swap(formatVersion=4): unknown data at IX_RESERVED18_OFFSET\n");
      UVar5 = U_UNSUPPORTED_ERROR;
    }
  }
  *pErrorCode = UVar5;
  iVar4 = 0;
LAB_002b9a18:
  iVar3 = 0;
  if (*pErrorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    iVar3 = iVar4 + iVar2;
  }
  return iVar3;
}

Assistant:

U_CAPI int32_t U_EXPORT2
ucol_swap(const UDataSwapper *ds,
          const void *inData, int32_t length, void *outData,
          UErrorCode *pErrorCode) {
    if(U_FAILURE(*pErrorCode)) { return 0; }

    /* udata_swapDataHeader checks the arguments */
    int32_t headerSize=udata_swapDataHeader(ds, inData, length, outData, pErrorCode);
    if(U_FAILURE(*pErrorCode)) {
        // Try to swap the old format version which did not have a standard data header.
        *pErrorCode=U_ZERO_ERROR;
        return swapFormatVersion3(ds, inData, length, outData, pErrorCode);
    }

    /* check data format and format version */
    const UDataInfo &info=*(const UDataInfo *)((const char *)inData+4);
    if(!(
        info.dataFormat[0]==0x55 &&   // dataFormat="UCol"
        info.dataFormat[1]==0x43 &&
        info.dataFormat[2]==0x6f &&
        info.dataFormat[3]==0x6c &&
        (3<=info.formatVersion[0] && info.formatVersion[0]<=5)
    )) {
        udata_printError(ds, "ucol_swap(): data format %02x.%02x.%02x.%02x "
                         "(format version %02x.%02x) is not recognized as collation data\n",
                         info.dataFormat[0], info.dataFormat[1],
                         info.dataFormat[2], info.dataFormat[3],
                         info.formatVersion[0], info.formatVersion[1]);
        *pErrorCode=U_UNSUPPORTED_ERROR;
        return 0;
    }

    inData=(const char *)inData+headerSize;
    if(length>=0) { length-=headerSize; }
    outData=(char *)outData+headerSize;
    int32_t collationSize;
    if(info.formatVersion[0]>=4) {
        collationSize=swapFormatVersion4(ds, inData, length, outData, *pErrorCode);
    } else {
        collationSize=swapFormatVersion3(ds, inData, length, outData, pErrorCode);
    }
    if(U_SUCCESS(*pErrorCode)) {
        return headerSize+collationSize;
    } else {
        return 0;
    }
}